

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_struct_member
          (CompilerMSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,string *qualifier
          ,uint32_t param_5)

{
  bool bVar1;
  ExecutionModel EVar2;
  BuiltIn builtin;
  uint32_t pad_len;
  BuiltIn local_50;
  uint32_t local_4c;
  string local_48;
  
  local_4c = index;
  bVar1 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationPaddingTarget);
  if (bVar1) {
    local_48._M_dataplus._M_p._0_4_ =
         Compiler::get_extended_member_decoration
                   ((Compiler *)this,(type->super_IVariant).self.id,local_4c,
                    SPIRVCrossDecorationPaddingTarget);
    CompilerGLSL::
    statement<char_const(&)[8],unsigned_int&,char_const(&)[5],char_const(&)[2],unsigned_int&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [8])"char _m",&local_4c,(char (*) [5])"_pad",
               (char (*) [2])0x2c1a1a,(uint *)&local_48,(char (*) [3])0x2c0549);
  }
  local_50 = BuiltInMax;
  EVar2 = Compiler::get_execution_model((Compiler *)this);
  if ((((EVar2 == ExecutionModelMeshEXT) &&
       (bVar1 = Compiler::is_member_builtin((Compiler *)this,type,local_4c,&local_50), bVar1)) &&
      (bVar1 = Compiler::has_active_builtin((Compiler *)this,local_50,StorageClassOutput), !bVar1))
     && (bVar1 = Compiler::has_active_builtin((Compiler *)this,local_50,StorageClassInput), !bVar1))
  {
    return;
  }
  this->builtin_declaration = true;
  to_struct_member(&local_48,this,type,member_type_id,local_4c,qualifier);
  CompilerGLSL::statement<std::__cxx11::string>(&this->super_CompilerGLSL,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(uint32_t)local_48._M_dataplus._M_p) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_48._M_dataplus._M_p._4_4_,(uint32_t)local_48._M_dataplus._M_p));
  }
  this->builtin_declaration = false;
  return;
}

Assistant:

void CompilerMSL::emit_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier, uint32_t)
{
	// If this member requires padding to maintain its declared offset, emit a dummy padding member before it.
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationPaddingTarget))
	{
		uint32_t pad_len = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPaddingTarget);
		statement("char _m", index, "_pad", "[", pad_len, "];");
	}

	BuiltIn builtin = BuiltInMax;
	if (is_mesh_shader() && is_member_builtin(type, index, &builtin))
	{
		if (!has_active_builtin(builtin, StorageClassOutput) && !has_active_builtin(builtin, StorageClassInput))
		{
			// Do not emit unused builtins in mesh-output blocks
			return;
		}
	}

	// Handle HLSL-style 0-based vertex/instance index.
	builtin_declaration = true;
	statement(to_struct_member(type, member_type_id, index, qualifier));
	builtin_declaration = false;
}